

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QList<double> * __thiscall
QList<double>::fill(QList<double> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  double *pdVar2;
  undefined1 auVar3 [16];
  qsizetype qVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  pair<QTypedArrayData<double>_*,_double_*> local_38;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc < newSize)) {
    qVar4 = QArrayDataPointer<double>::detachCapacity(&this->d,newSize);
    local_38 = QTypedArrayData<double>::allocate(qVar4,KeepSize);
    local_28 = 0;
    QtPrivate::QPodArrayOps<double>::copyAppend((QPodArrayOps<double> *)&local_38,newSize,t);
    auVar3._0_8_ = (this->d).d;
    auVar3._8_8_ = (this->d).ptr;
    (this->d).d = local_38.first;
    (this->d).ptr = local_38.second;
    qVar4 = (this->d).size;
    (this->d).size = local_28;
    local_38 = (pair<QTypedArrayData<double>_*,_double_*>)auVar3;
    local_28 = qVar4;
    QArrayDataPointer<double>::~QArrayDataPointer((QArrayDataPointer<double> *)&local_38);
  }
  else {
    pdVar2 = (this->d).ptr;
    lVar5 = (this->d).size;
    if (newSize <= lVar5) {
      lVar5 = newSize;
    }
    for (lVar6 = 0; lVar5 * 8 != lVar6; lVar6 = lVar6 + 8) {
      *(parameter_type *)((long)pdVar2 + lVar6) = t;
    }
    lVar5 = (this->d).size;
    if (newSize - lVar5 == 0 || newSize < lVar5) {
      if (newSize < lVar5) {
        (this->d).size = newSize;
      }
    }
    else {
      QtPrivate::QPodArrayOps<double>::copyAppend((QPodArrayOps<double> *)this,newSize - lVar5,t);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}